

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O0

int Llb_ManComputeBestQuant(Llb_Mtr_t *p)

{
  int iVar1;
  uint local_24;
  int RetValue;
  int WeightCur;
  int WeightBest;
  int k;
  int i;
  Llb_Mtr_t *p_local;
  
  RetValue = -100000;
  local_24 = 0xffffffff;
  for (WeightBest = 1; WeightCur = WeightBest, WeightBest < p->nCols + -1;
      WeightBest = WeightBest + 1) {
    while (WeightCur = WeightCur + 1, WeightCur < p->nCols + -1) {
      if ((((p->pColSums[WeightBest] != 0) &&
           (p->pColSums[WeightBest] <= p->pMan->pPars->nClusterMax)) &&
          (p->pColSums[WeightCur] != 0)) &&
         (((p->pColSums[WeightCur] <= p->pMan->pPars->nClusterMax &&
           (iVar1 = Llb_ManComputeCommonQuant(p,WeightBest,WeightCur), 0 < iVar1)) &&
          (RetValue < iVar1)))) {
        local_24 = WeightBest << 0x10 | WeightCur;
        RetValue = iVar1;
      }
    }
  }
  return local_24;
}

Assistant:

int Llb_ManComputeBestQuant( Llb_Mtr_t * p )
{
    int i, k, WeightBest = -100000, WeightCur, RetValue = -1;
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
    {
        if ( p->pColSums[i] == 0 || p->pColSums[i] > p->pMan->pPars->nClusterMax )
            continue;
        if ( p->pColSums[k] == 0 || p->pColSums[k] > p->pMan->pPars->nClusterMax )
            continue;

        WeightCur = Llb_ManComputeCommonQuant( p, i, k );
        if ( WeightCur <= 0 )
            continue;
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            RetValue   = (i << 16) | k;
        }
    }
//    printf( "Choosing best quant Weight %4d\n", WeightCur );
    return RetValue;
}